

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

size_t Catch::listTests(Config *config)

{
  bool bVar1;
  ostream *poVar2;
  TextAttributes *this;
  pointer this_00;
  TestCaseInfo *this_01;
  long *in_RDI;
  Colour colourGuard;
  Code colour;
  TestCaseInfo *testCaseInfo;
  const_iterator itEnd;
  const_iterator it;
  vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> matchedTestCases;
  TextAttributes tagsAttr;
  TextAttributes nameAttr;
  size_t matchedTests;
  TestSpec testSpec;
  pluralise *in_stack_fffffffffffffc98;
  size_t sVar3;
  TestSpecParser *in_stack_fffffffffffffca0;
  TestSpecParser *in_stack_fffffffffffffca8;
  ostream *in_stack_fffffffffffffcb0;
  Text *in_stack_fffffffffffffcb8;
  ostream *in_stack_fffffffffffffcc0;
  allocator *paVar4;
  string *in_stack_fffffffffffffcc8;
  TestSpecParser *in_stack_fffffffffffffcd0;
  IConfig *in_stack_fffffffffffffcd8;
  TestSpec *in_stack_fffffffffffffce0;
  vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *in_stack_fffffffffffffce8;
  allocator local_2b9;
  string local_2b8 [79];
  allocator local_269;
  string local_268 [168];
  TextAttributes *in_stack_fffffffffffffe40;
  string *in_stack_fffffffffffffe48;
  Text *in_stack_fffffffffffffe50;
  __normal_iterator<const_Catch::TestCase_*,_std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>_>
  local_148 [4];
  TextAttributes local_128;
  TextAttributes local_108;
  size_t local_e8;
  allocator local_d9;
  string local_d8 [208];
  long *local_8;
  
  local_8 = in_RDI;
  (**(code **)(*in_RDI + 0x68))();
  TestSpec::TestSpec((TestSpec *)in_stack_fffffffffffffca0,(TestSpec *)in_stack_fffffffffffffc98);
  (**(code **)(*local_8 + 0x68))();
  bVar1 = TestSpec::hasFilters((TestSpec *)0x1bd028);
  if (bVar1) {
    poVar2 = cout();
    std::operator<<(poVar2,"Matching test cases:\n");
  }
  else {
    poVar2 = cout();
    std::operator<<(poVar2,"All available test cases:\n");
    ITagAliasRegistry::get();
    TestSpecParser::TestSpecParser
              (in_stack_fffffffffffffca0,(ITagAliasRegistry *)in_stack_fffffffffffffc98);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_d8,"*",&local_d9);
    TestSpecParser::parse(in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8);
    TestSpecParser::testSpec(in_stack_fffffffffffffca8);
    TestSpec::operator=((TestSpec *)in_stack_fffffffffffffca0,(TestSpec *)in_stack_fffffffffffffc98)
    ;
    TestSpec::~TestSpec((TestSpec *)0x1bd11a);
    std::__cxx11::string::~string(local_d8);
    std::allocator<char>::~allocator((allocator<char> *)&local_d9);
    TestSpecParser::~TestSpecParser(in_stack_fffffffffffffca0);
  }
  local_e8 = 0;
  Tbc::TextAttributes::TextAttributes(&local_108);
  Tbc::TextAttributes::TextAttributes(&local_128);
  this = Tbc::TextAttributes::setInitialIndent(&local_108,2);
  Tbc::TextAttributes::setIndent(this,4);
  Tbc::TextAttributes::setIndent(&local_128,6);
  getAllTestCasesSorted((IConfig *)0x1bd210);
  filterTests(in_stack_fffffffffffffce8,in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8);
  std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>::begin
            ((vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *)in_stack_fffffffffffffc98)
  ;
  __gnu_cxx::
  __normal_iterator<Catch::TestCase_const*,std::vector<Catch::TestCase,std::allocator<Catch::TestCase>>>
  ::__normal_iterator<Catch::TestCase*>
            ((__normal_iterator<const_Catch::TestCase_*,_std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>_>
              *)in_stack_fffffffffffffca0,
             (__normal_iterator<Catch::TestCase_*,_std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>_>
              *)in_stack_fffffffffffffc98);
  std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>::end
            ((vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *)in_stack_fffffffffffffc98)
  ;
  __gnu_cxx::
  __normal_iterator<Catch::TestCase_const*,std::vector<Catch::TestCase,std::allocator<Catch::TestCase>>>
  ::__normal_iterator<Catch::TestCase*>
            ((__normal_iterator<const_Catch::TestCase_*,_std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>_>
              *)in_stack_fffffffffffffca0,
             (__normal_iterator<Catch::TestCase_*,_std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>_>
              *)in_stack_fffffffffffffc98);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<const_Catch::TestCase_*,_std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>_>
                             *)in_stack_fffffffffffffca0,
                            (__normal_iterator<const_Catch::TestCase_*,_std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>_>
                             *)in_stack_fffffffffffffc98), bVar1) {
    local_e8 = local_e8 + 1;
    this_00 = __gnu_cxx::
              __normal_iterator<const_Catch::TestCase_*,_std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>_>
              ::operator->(local_148);
    this_01 = TestCase::getTestCaseInfo(this_00);
    TestCaseInfo::isHidden(this_01);
    Colour::Colour((Colour *)in_stack_fffffffffffffca0,
                   (Code)((ulong)in_stack_fffffffffffffc98 >> 0x20));
    cout();
    Tbc::Text::Text(in_stack_fffffffffffffe50,in_stack_fffffffffffffe48,in_stack_fffffffffffffe40);
    poVar2 = Tbc::operator<<(in_stack_fffffffffffffcc0,in_stack_fffffffffffffcb8);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    Tbc::Text::~Text((Text *)in_stack_fffffffffffffca0);
    bVar1 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::empty((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)0x1bd38e);
    if (!bVar1) {
      cout();
      Tbc::Text::Text(in_stack_fffffffffffffe50,in_stack_fffffffffffffe48,in_stack_fffffffffffffe40)
      ;
      poVar2 = Tbc::operator<<(in_stack_fffffffffffffcc0,in_stack_fffffffffffffcb8);
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      Tbc::Text::~Text((Text *)in_stack_fffffffffffffca0);
    }
    Colour::~Colour((Colour *)0x1bd483);
    __gnu_cxx::
    __normal_iterator<const_Catch::TestCase_*,_std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>_>
    ::operator++(local_148);
  }
  (**(code **)(*local_8 + 0x68))();
  bVar1 = TestSpec::hasFilters((TestSpec *)0x1bd4c9);
  if (bVar1) {
    in_stack_fffffffffffffcb0 = cout();
    paVar4 = &local_2b9;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_2b8,"matching test case",paVar4);
    pluralise::pluralise
              ((pluralise *)in_stack_fffffffffffffca0,(size_t)in_stack_fffffffffffffc98,
               (string *)0x1bd66b);
    poVar2 = operator<<((ostream *)in_stack_fffffffffffffca0,in_stack_fffffffffffffc98);
    poVar2 = std::operator<<(poVar2,"\n");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    pluralise::~pluralise((pluralise *)0x1bd6be);
    std::__cxx11::string::~string(local_2b8);
    std::allocator<char>::~allocator((allocator<char> *)&local_2b9);
  }
  else {
    cout();
    paVar4 = &local_269;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_268,"test case",paVar4);
    pluralise::pluralise
              ((pluralise *)in_stack_fffffffffffffca0,(size_t)in_stack_fffffffffffffc98,
               (string *)0x1bd52f);
    poVar2 = operator<<((ostream *)in_stack_fffffffffffffca0,in_stack_fffffffffffffc98);
    poVar2 = std::operator<<(poVar2,"\n");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    pluralise::~pluralise((pluralise *)0x1bd582);
    std::__cxx11::string::~string(local_268);
    std::allocator<char>::~allocator((allocator<char> *)&local_269);
  }
  sVar3 = local_e8;
  std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>::~vector
            ((vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *)in_stack_fffffffffffffcb0)
  ;
  TestSpec::~TestSpec((TestSpec *)0x1bd769);
  return sVar3;
}

Assistant:

inline std::size_t listTests( Config const& config ) {

        TestSpec testSpec = config.testSpec();
        if( config.testSpec().hasFilters() )
            Catch::cout() << "Matching test cases:\n";
        else {
            Catch::cout() << "All available test cases:\n";
            testSpec = TestSpecParser( ITagAliasRegistry::get() ).parse( "*" ).testSpec();
        }

        std::size_t matchedTests = 0;
        TextAttributes nameAttr, tagsAttr;
        nameAttr.setInitialIndent( 2 ).setIndent( 4 );
        tagsAttr.setIndent( 6 );

        std::vector<TestCase> matchedTestCases = filterTests( getAllTestCasesSorted( config ), testSpec, config );
        for( std::vector<TestCase>::const_iterator it = matchedTestCases.begin(), itEnd = matchedTestCases.end();
                it != itEnd;
                ++it ) {
            matchedTests++;
            TestCaseInfo const& testCaseInfo = it->getTestCaseInfo();
            Colour::Code colour = testCaseInfo.isHidden()
                ? Colour::SecondaryText
                : Colour::None;
            Colour colourGuard( colour );

            Catch::cout() << Text( testCaseInfo.name, nameAttr ) << std::endl;
            if( !testCaseInfo.tags.empty() )
                Catch::cout() << Text( testCaseInfo.tagsAsString, tagsAttr ) << std::endl;
        }

        if( !config.testSpec().hasFilters() )
            Catch::cout() << pluralise( matchedTests, "test case" ) << "\n" << std::endl;
        else
            Catch::cout() << pluralise( matchedTests, "matching test case" ) << "\n" << std::endl;
        return matchedTests;
    }